

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::PrettyUnitTestResultPrinter::PrintFailedTests(UnitTest *unit_test)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  TestCase *this;
  TestInfo *test_info;
  int j;
  int i;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = UnitTest::failed_test_count(unit_test);
  if (iVar3 != 0) {
    for (iVar3 = 0;
        iVar3 < (int)((ulong)((long)(unit_test->impl_->test_cases_).
                                    super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(unit_test->impl_->test_cases_).
                                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar3 = iVar3 + 1) {
      this = UnitTest::GetTestCase(unit_test,iVar3);
      if (this->should_run_ == true) {
        iVar4 = TestCase::failed_test_count(this);
        if (iVar4 != 0) {
          for (iVar4 = 0;
              iVar4 < (int)((ulong)((long)(this->test_info_list_).
                                          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->test_info_list_).
                                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3);
              iVar4 = iVar4 + 1) {
            test_info = TestCase::GetTestInfo(this,iVar4);
            if (test_info->should_run_ == true) {
              bVar2 = TestResult::Passed(&test_info->result_);
              if (!bVar2) {
                ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
                printf("%s.%s",(this->name_)._M_dataplus._M_p,(test_info->name_)._M_dataplus._M_p);
                PrintFullTestCommentIfPresent(test_info);
                putchar(10);
              }
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PrettyUnitTestResultPrinter::PrintFailedTests(const UnitTest& unit_test) {
  const int failed_test_count = unit_test.failed_test_count();
  if (failed_test_count == 0) {
    return;
  }

  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    const TestCase& test_case = *unit_test.GetTestCase(i);
    if (!test_case.should_run() || (test_case.failed_test_count() == 0)) {
      continue;
    }
    for (int j = 0; j < test_case.total_test_count(); ++j) {
      const TestInfo& test_info = *test_case.GetTestInfo(j);
      if (!test_info.should_run() || test_info.result()->Passed()) {
        continue;
      }
      ColoredPrintf(COLOR_RED, "[  FAILED  ] ");
      printf("%s.%s", test_case.name(), test_info.name());
      PrintFullTestCommentIfPresent(test_info);
      printf("\n");
    }
  }
}